

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSweptDiskSolid::IfcSweptDiskSolid(IfcSweptDiskSolid *this)

{
  IfcSweptDiskSolid *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x70,"IfcSweptDiskSolid");
  IfcSolidModel::IfcSolidModel(&this->super_IfcSolidModel,&PTR_construction_vtable_24__00f72808);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSweptDiskSolid,_5UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSweptDiskSolid,_5UL> *)
             &(this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.field_0x30,
             &PTR_construction_vtable_24__00f72880);
  (this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf72750;
  *(undefined8 *)&this->field_0x70 = 0xf727f0;
  *(undefined8 *)
   &(this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf72778;
  *(undefined8 *)
   &(this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf727a0;
  *(undefined8 *)&(this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.field_0x30 =
       0xf727c8;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcCurve> *)&(this->super_IfcSolidModel).field_0x40,
             (LazyObject *)0x0);
  STEP::Maybe<double>::Maybe(&this->InnerRadius);
  return;
}

Assistant:

IfcSweptDiskSolid() : Object("IfcSweptDiskSolid") {}